

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  Particle<(pica::Dimension)2> a;
  Particle<(pica::Dimension)2> b;
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined8 in_RDI;
  PositionType PVar4;
  AssertionResult gtest_ar_;
  ParticleType copyParticle;
  ParticleType particle;
  FactorType factor;
  MomentumType momentum;
  PositionType position;
  undefined1 local_218 [7];
  Particle<(pica::Dimension)2> *in_stack_fffffffffffffdf0;
  FactorType in_stack_fffffffffffffdf8;
  MomentumType *in_stack_fffffffffffffe00;
  PositionType *in_stack_fffffffffffffe08;
  int line;
  Particle<(pica::Dimension)2> *in_stack_fffffffffffffe10;
  Real in_stack_fffffffffffffe18;
  Type type;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *in_stack_fffffffffffffe20;
  AssertionResult *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined1 in_stack_fffffffffffffe88 [40];
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  Message *in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *pBStack_110;
  undefined8 local_108;
  String *pSStack_100;
  char *pcStack_f0;
  undefined8 local_e8;
  int iStack_e4;
  char *pcStack_e0;
  undefined8 local_d8;
  Type TStack_d4;
  AssertHelper *pAStack_d0;
  AssertionResult local_c8;
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  undefined8 local_38;
  Vector3<double> local_30;
  double local_18;
  double local_10;
  
  PVar4 = BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::getPosition
                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                     (Real)in_stack_fffffffffffffe10,(Real)in_stack_fffffffffffffe08);
  local_18 = PVar4.x;
  local_10 = PVar4.y;
  pica::Vector3<double>::Vector3(&local_30,431.124,-54.12,5643.176);
  local_38 = 0x3fffe978d4fdf3b6;
  pica::Particle<(pica::Dimension)2>::Particle
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8,(TypeIndexType)((ulong)in_stack_fffffffffffffdf0 >> 0x30));
  pica::Particle<(pica::Dimension)2>::Particle(in_stack_fffffffffffffdf0);
  memcpy(local_b8,local_78,0x3a);
  memcpy(&local_108,local_78,0x40);
  memcpy(&stack0xfffffffffffffeb8,local_b8,0x40);
  _local_218 = local_108;
  a.position.y = (double)local_218;
  a.position.x = (double)in_RDI;
  a.p.x._0_4_ = in_stack_fffffffffffffe80;
  a.p.x._4_4_ = in_stack_fffffffffffffe84;
  a.p.y = (double)in_stack_fffffffffffffe88._0_8_;
  a.p.z = (double)in_stack_fffffffffffffe88._8_8_;
  a.factor = (FactorType)in_stack_fffffffffffffe88._16_8_;
  a.invGamma = (GammaType)in_stack_fffffffffffffe88._24_8_;
  a.typeIndex = in_stack_fffffffffffffe88._32_2_;
  a._58_6_ = in_stack_fffffffffffffe88._34_6_;
  b.position.y = (double)in_stack_fffffffffffffeb8;
  b.position.x = (double)in_stack_fffffffffffffeb0;
  b.p.x = (double)in_stack_fffffffffffffec0;
  b.p.y = (double)in_stack_fffffffffffffec8;
  b.p.z = (double)in_stack_fffffffffffffed0;
  b.factor = (FactorType)in_stack_fffffffffffffed8;
  b.invGamma = (GammaType)in_stack_fffffffffffffee0;
  b._56_8_ = in_stack_fffffffffffffee8;
  line = iStack_e4;
  type = TStack_d4;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
  eqParticles_<pica::Particle<(pica::Dimension)2>,pica::Particle<(pica::Dimension)2>>
            (pBStack_110,a,b);
  uVar2 = _local_218;
  uVar1 = (ulong)_local_218 >> 0x38;
  bVar3 = SUB81(uVar1,0);
  _local_218 = uVar2;
  testing::AssertionResult::AssertionResult((AssertionResult *)pSStack_100,bVar3);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar3) {
    testing::Message::Message((Message *)pAStack_d0);
    testing::internal::GetBoolAssertionFailureMessage
              (in_stack_fffffffffffffe68,(char *)pBStack_110,in_stack_fffffffffffffee8,
               (char *)in_stack_fffffffffffffee0);
    testing::internal::String::c_str((String *)&stack0xfffffffffffffe88);
    testing::internal::AssertHelper::AssertHelper(pAStack_d0,type,pcStack_e0,line,pcStack_f0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pSStack_100);
    testing::internal::String::~String(pSStack_100);
    testing::Message::~Message((Message *)0x1fdc32);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fdcdc);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, Assignment)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(432.453, -3452.15, -15.125);
    MomentumType momentum(431.124, -54.12, 5643.176);
    FactorType factor = 1.9945;
    ParticleType particle(position, momentum, factor, 0);
    ParticleType copyParticle;
    copyParticle = particle;
    ASSERT_TRUE(this->eqParticles_(particle, copyParticle));
}